

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O3

int KINConstraint(KINMem kin_mem)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,kin_mem->kin_uu,kin_mem->kin_pp,
               kin_mem->kin_vtemp1);
  iVar1 = N_VConstrMask(kin_mem->kin_constraints,kin_mem->kin_vtemp1,kin_mem->kin_vtemp2);
  iVar2 = 0;
  if (iVar1 == 0) {
    N_VAbs(kin_mem->kin_pp,kin_mem->kin_vtemp1);
    N_VProd(kin_mem->kin_vtemp2,kin_mem->kin_vtemp1);
    N_VAbs(kin_mem->kin_uu,kin_mem->kin_vtemp2);
    dVar3 = (double)N_VMinQuotient(kin_mem->kin_vtemp2,kin_mem->kin_vtemp1);
    kin_mem->kin_stepmul = dVar3 * 0.9;
    iVar2 = -0x3e4;
  }
  return iVar2;
}

Assistant:

static int KINConstraint(KINMem kin_mem)
{
  N_VLinearSum(ONE, kin_mem->kin_uu, ONE, kin_mem->kin_pp, kin_mem->kin_vtemp1);

  /* if vtemp1[i] violates constraint[i] then vtemp2[i] = 1
     else vtemp2[i] = 0 (vtemp2 is the mask vector) */

  if (N_VConstrMask(kin_mem->kin_constraints, kin_mem->kin_vtemp1,
                    kin_mem->kin_vtemp2))
  {
    return (KIN_SUCCESS);
  }

  /* vtemp1[i] = SUNRabs(pp[i]) */

  N_VAbs(kin_mem->kin_pp, kin_mem->kin_vtemp1);

  /* consider vtemp1[i] only if vtemp2[i] = 1 (constraint violated) */

  N_VProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp1, kin_mem->kin_vtemp1);

  N_VAbs(kin_mem->kin_uu, kin_mem->kin_vtemp2);
  kin_mem->kin_stepmul = POINT9 * N_VMinQuotient(kin_mem->kin_vtemp2,
                                                 kin_mem->kin_vtemp1);

  return (CONSTR_VIOLATED);
}